

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O0

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::ByName>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::ByName> *this,BamReader *reader)

{
  bool bVar1;
  long in_RSI;
  const_iterator in_RDI;
  BamReader *itemReader;
  MergeItem *item;
  DataIterator dataEnd;
  DataIterator dataIter;
  string *filenameToRemove;
  multiset<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,_std::allocator<BamTools::Internal::MergeItem>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_78 [32];
  BamReader *local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  string local_38 [32];
  string *local_18;
  
  if (in_RSI != 0) {
    BamReader::GetFilename_abi_cxx11_((BamReader *)in_stack_ffffffffffffff48);
    local_18 = local_38;
    local_40._M_node =
         (_Base_ptr)
         std::
         multiset<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,_std::allocator<BamTools::Internal::MergeItem>_>
         ::begin(in_stack_ffffffffffffff48);
    local_48._M_node =
         (_Base_ptr)
         std::
         multiset<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,_std::allocator<BamTools::Internal::MergeItem>_>
         ::end(in_stack_ffffffffffffff48);
    while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
      local_50 = std::_Rb_tree_const_iterator<BamTools::Internal::MergeItem>::operator*
                           ((_Rb_tree_const_iterator<BamTools::Internal::MergeItem> *)0x1aa4f1);
      local_58 = local_50->Reader;
      if (local_58 != (BamReader *)0x0) {
        BamReader::GetFilename_abi_cxx11_((BamReader *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff57 =
             std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string(local_78);
        if ((in_stack_ffffffffffffff57 & 1) != 0) {
          std::
          multiset<BamTools::Internal::MergeItem,BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,std::allocator<BamTools::Internal::MergeItem>>
          ::erase_abi_cxx11_((multiset<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,_std::allocator<BamTools::Internal::MergeItem>_>
                              *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_RDI
                            );
          break;
        }
      }
      std::_Rb_tree_const_iterator<BamTools::Internal::MergeItem>::operator++
                ((_Rb_tree_const_iterator<BamTools::Internal::MergeItem> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

inline void MultiMerger<Compare>::Remove(BamReader* reader) {

    if ( reader == 0 ) return;
    const std::string& filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd  = m_data.end();
    for ( ; dataIter != dataEnd; ++dataIter ) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if ( itemReader == 0 ) continue;

        // remove iterator on match
        if ( itemReader->GetFilename() == filenameToRemove ) {
            m_data.erase(dataIter);
            return;
        }
    }
}